

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void av1_accumulate_pack_bs_thread_data(AV1_COMP *cpi,ThreadData_conflict *td)

{
  RefCntBuffer *pRVar1;
  int local_1c;
  InterpFilter filter;
  int do_max_mv_magnitude_update;
  ThreadData_conflict *td_local;
  AV1_COMP *cpi_local;
  
  (cpi->rc).coefficient_size = td->coefficient_size + (cpi->rc).coefficient_size;
  if (((cpi->sf).mv_sf.auto_mv_step_size != 0) && ((cpi->do_frame_data_update & 1U) != 0)) {
    if (td->max_mv_magnitude < (cpi->mv_search_params).max_mv_magnitude) {
      local_1c = (cpi->mv_search_params).max_mv_magnitude;
    }
    else {
      local_1c = td->max_mv_magnitude;
    }
    (cpi->mv_search_params).max_mv_magnitude = local_1c;
  }
  for (filter = EIGHTTAP_REGULAR; filter < MULTITAP_SHARP2; filter = filter + EIGHTTAP_SMOOTH) {
    pRVar1 = (cpi->common).cur_frame;
    pRVar1->interp_filter_selected[filter] =
         td->interp_filter_selected[filter] + pRVar1->interp_filter_selected[filter];
  }
  return;
}

Assistant:

void av1_accumulate_pack_bs_thread_data(AV1_COMP *const cpi,
                                        ThreadData const *td) {
  int do_max_mv_magnitude_update = 1;
  cpi->rc.coefficient_size += td->coefficient_size;

  // Disable max_mv_magnitude update for parallel frames based on update flag.
  if (!cpi->do_frame_data_update) do_max_mv_magnitude_update = 0;

  if (cpi->sf.mv_sf.auto_mv_step_size && do_max_mv_magnitude_update)
    cpi->mv_search_params.max_mv_magnitude =
        AOMMAX(cpi->mv_search_params.max_mv_magnitude, td->max_mv_magnitude);

  for (InterpFilter filter = EIGHTTAP_REGULAR; filter < SWITCHABLE; filter++)
    cpi->common.cur_frame->interp_filter_selected[filter] +=
        td->interp_filter_selected[filter];
}